

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall clip_ctx::clip_ctx(clip_ctx *this,clip_context_params *ctx_params)

{
  undefined8 uVar1;
  unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *this_00;
  ggml_backend **ppgVar2;
  ggml_backend_buffer_type **ppgVar3;
  size_type sVar4;
  byte *in_RSI;
  undefined1 *in_RDI;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *this_01;
  pointer in_stack_ffffffffffffff18;
  clip_vision_model *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *in_stack_ffffffffffffff30;
  undefined8 local_90;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 8) = 2;
  clip_vision_model::clip_vision_model(in_stack_ffffffffffffff20);
  *(undefined4 *)(in_RDI + 0x300) = 0;
  in_RDI[800] = 0;
  in_RDI[0x321] = 0;
  std::unique_ptr<gguf_context,gguf_context_deleter>::unique_ptr<gguf_context_deleter,void>
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_ffffffffffffff20);
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_ffffffffffffff20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1873a9);
  std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::vector
            ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x1873c5);
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::vector
            ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
             0x1873e1);
  std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>::
  unique_ptr<ggml_backend_buffer_deleter,void>
            ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
             in_stack_ffffffffffffff20);
  *(undefined4 *)(in_RDI + 0x398) = 0x2000;
  std::unique_ptr<ggml_backend_sched,ggml_backend_sched_deleter>::
  unique_ptr<ggml_backend_sched_deleter,void>
            ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)in_stack_ffffffffffffff20
            );
  uVar1 = ggml_backend_init_by_type(0,0);
  *(undefined8 *)(in_RDI + 0x388) = uVar1;
  if ((*in_RSI & 1) == 0) {
    local_90 = 0;
  }
  else {
    local_90 = ggml_backend_init_by_type(1,0);
  }
  *(undefined8 *)(in_RDI + 0x380) = local_90;
  if (*(long *)(in_RDI + 0x380) == 0) {
    *(undefined8 *)(in_RDI + 0x380) = *(undefined8 *)(in_RDI + 0x388);
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: CLIP using CPU backend\n","clip_ctx");
    }
  }
  else {
    if ((int)g_logger_state.verbosity_thold < 3) {
      uVar1 = ggml_backend_name(*(undefined8 *)(in_RDI + 0x380));
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: CLIP using %s backend\n","clip_ctx",uVar1);
    }
    std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::push_back
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    ggml_backend_get_default_buffer_type(*(undefined8 *)(in_RDI + 0x380));
    std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::push_back
              ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
               in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
  }
  std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::push_back
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ggml_backend_get_default_buffer_type(*(undefined8 *)(in_RDI + 0x388));
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::push_back
            ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
             in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
  this_00 = (unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)(in_RDI + 0x3a0);
  this_01 = (vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)(in_RDI + 0x350);
  ppgVar2 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::data
                      ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x1876bf);
  ppgVar3 = std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::
            data((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
                 0x1876d8);
  sVar4 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size(this_01);
  ggml_backend_sched_new(ppgVar2,ppgVar3,sVar4 & 0xffffffff,0x2000,0);
  std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::reset
            (this_00,in_stack_ffffffffffffff18);
  return;
}

Assistant:

clip_ctx(clip_context_params & ctx_params) {
        backend_cpu = ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr);
        backend     = ctx_params.use_gpu
                        ? ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_GPU, nullptr)
                        : nullptr;

        if (backend) {
            LOG_INF("%s: CLIP using %s backend\n", __func__, ggml_backend_name(backend));
            backend_ptrs.push_back(backend);
            backend_buft.push_back(ggml_backend_get_default_buffer_type(backend));
        } else {
            backend = backend_cpu;
            LOG_INF("%s: CLIP using CPU backend\n", __func__);
        }

        backend_ptrs.push_back(backend_cpu);
        backend_buft.push_back(ggml_backend_get_default_buffer_type(backend_cpu));

        sched.reset(
            ggml_backend_sched_new(backend_ptrs.data(), backend_buft.data(), backend_ptrs.size(), 8192, false)
        );
    }